

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

void givit(int type,permonst *ptr)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  int local_1c;
  int chance;
  permonst *ptr_local;
  int type_local;
  
  switch(type) {
  case 6:
    if (((ptr == mons + 1) || (ptr == mons + 0x65)) && (iVar3 = rn2(4), iVar3 == 0)) {
      local_1c = 1;
    }
    else {
      local_1c = 0xf;
    }
    break;
  default:
    local_1c = 0xf;
    break;
  case 0xe:
    local_1c = 10;
    break;
  case 0xf:
    local_1c = 0xc;
    break;
  case 0x19:
    local_1c = 1;
  }
  cVar1 = ptr->mlevel;
  iVar3 = rn2(local_1c);
  if (iVar3 < cVar1) {
    switch(type) {
    case 1:
      if ((u.uprops[1].intrinsic & 0x4000000) == 0) {
        bVar5 = false;
        if (u.uprops[0x23].intrinsic != 0) {
          bVar5 = true;
          if ((u.uprops[0x24].extrinsic == 0) && (bVar5 = false, u.umonnum != u.umonster)) {
            bVar2 = dmgtype(youmonst.data,0x24);
            bVar5 = bVar2 != '\0';
          }
          bVar5 = (bool)(bVar5 ^ 1);
        }
        pcVar4 = "You feel a momentary chill.";
        if (bVar5) {
          pcVar4 = "You be chillin\'.";
        }
        pline(pcVar4);
        u.uprops[1].intrinsic = u.uprops[1].intrinsic | 0x4000000;
      }
      break;
    case 2:
      if ((u.uprops[2].intrinsic & 0x4000000) == 0) {
        pline("You feel full of hot air.");
        u.uprops[2].intrinsic = u.uprops[2].intrinsic | 0x4000000;
      }
      break;
    case 3:
      if ((u.uprops[3].intrinsic & 0x4000000) == 0) {
        pline("You feel wide awake.");
        u.uprops[3].intrinsic = u.uprops[3].intrinsic | 0x4000000;
      }
      break;
    case 4:
      if ((u.uprops[4].intrinsic & 0x4000000) == 0) {
        bVar5 = false;
        if (u.uprops[0x23].intrinsic != 0) {
          bVar5 = true;
          if ((u.uprops[0x24].extrinsic == 0) && (bVar5 = false, u.umonnum != u.umonster)) {
            bVar2 = dmgtype(youmonst.data,0x24);
            bVar5 = bVar2 != '\0';
          }
          bVar5 = (bool)(bVar5 ^ 1);
        }
        pcVar4 = "You feel very firm.";
        if (bVar5) {
          pcVar4 = "You feel totally together, man.";
        }
        pline(pcVar4);
        u.uprops[4].intrinsic = u.uprops[4].intrinsic | 0x4000000;
      }
      break;
    case 5:
      if ((u.uprops[5].intrinsic & 0x4000000) == 0) {
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
          pline("Your health currently feels amplified!");
        }
        else {
          pline("You feel grounded in reality.");
        }
        u.uprops[5].intrinsic = u.uprops[5].intrinsic | 0x4000000;
      }
      break;
    case 6:
      if ((u.uprops[6].intrinsic & 0x4000000) == 0) {
        bVar5 = true;
        if ((u.uprops[6].intrinsic == 0) && (bVar5 = true, u.uprops[6].extrinsic == 0)) {
          bVar5 = (youmonst.mintrinsics & 0x20) != 0;
        }
        pcVar4 = "You feel healthy.";
        if (bVar5) {
          pcVar4 = "You feel especially healthy.";
        }
        pline(pcVar4);
        u.uprops[6].intrinsic = u.uprops[6].intrinsic | 0x4000000;
      }
      break;
    default:
      break;
    case 0xe:
      if ((u.uprops[0xe].intrinsic & 0x4000000) == 0) {
        bVar5 = false;
        if (u.uprops[0x23].intrinsic != 0) {
          bVar5 = true;
          if ((u.uprops[0x24].extrinsic == 0) && (bVar5 = false, u.umonnum != u.umonster)) {
            bVar2 = dmgtype(youmonst.data,0x24);
            bVar5 = bVar2 != '\0';
          }
          bVar5 = (bool)(bVar5 ^ 1);
        }
        pcVar4 = "You feel very jumpy.";
        if (bVar5) {
          pcVar4 = "You feel diffuse.";
        }
        pline(pcVar4);
        u.uprops[0xe].intrinsic = u.uprops[0xe].intrinsic | 0x4000000;
      }
      break;
    case 0xf:
      if ((u.uprops[0xf].intrinsic & 0x4000000) == 0) {
        bVar5 = false;
        if (u.uprops[0x23].intrinsic != 0) {
          bVar5 = true;
          if ((u.uprops[0x24].extrinsic == 0) && (bVar5 = false, u.umonnum != u.umonster)) {
            bVar2 = dmgtype(youmonst.data,0x24);
            bVar5 = bVar2 != '\0';
          }
          bVar5 = (bool)(bVar5 ^ 1);
        }
        pcVar4 = "You feel in control of yourself.";
        if (bVar5) {
          pcVar4 = "You feel centered in your personal space.";
        }
        pline(pcVar4);
        u.uprops[0xf].intrinsic = u.uprops[0xf].intrinsic | 0x4000000;
      }
      break;
    case 0x19:
      if ((u.uprops[0x19].intrinsic & 0x4000000) == 0) {
        if (u.uprops[0x19].blocked == 0) {
          bVar5 = false;
          if (u.uprops[0x23].intrinsic != 0) {
            bVar5 = true;
            if ((u.uprops[0x24].extrinsic == 0) && (bVar5 = false, u.umonnum != u.umonster)) {
              bVar2 = dmgtype(youmonst.data,0x24);
              bVar5 = bVar2 != '\0';
            }
            bVar5 = (bool)(bVar5 ^ 1);
          }
          pcVar4 = "You feel a strange mental acuity.";
          if (bVar5) {
            pcVar4 = "You feel in touch with the cosmos.";
          }
          pline(pcVar4);
        }
        else {
          bVar5 = false;
          if (u.uprops[0x23].intrinsic != 0) {
            bVar5 = true;
            if ((u.uprops[0x24].extrinsic == 0) && (bVar5 = false, u.umonnum != u.umonster)) {
              bVar2 = dmgtype(youmonst.data,0x24);
              bVar5 = bVar2 != '\0';
            }
            bVar5 = (bool)(bVar5 ^ 1);
          }
          pcVar4 = "You feel a dull aching inside your head.";
          if (bVar5) {
            pcVar4 = "You feel a strange mental acuity.";
          }
          pline(pcVar4);
        }
        u.uprops[0x19].intrinsic = u.uprops[0x19].intrinsic | 0x4000000;
        if (((u.uprops[0x1e].intrinsic != 0) ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
          see_monsters();
        }
      }
    }
  }
  return;
}

Assistant:

static void givit(int type, const struct permonst *ptr)
{
	int chance;

	/* some intrinsics are easier to get than others */
	switch (type) {
		case POISON_RES:
			if ((ptr == &mons[PM_KILLER_BEE] ||
					ptr == &mons[PM_SCORPION]) && !rn2(4))
				chance = 1;
			else
				chance = 15;
			break;
		case TELEPORT:
			chance = 10;
			break;
		case TELEPORT_CONTROL:
			chance = 12;
			break;
		case TELEPAT:
			chance = 1;
			break;
		default:
			chance = 15;
			break;
	}

	if (ptr->mlevel <= rn2(chance))
		return;		/* failed die roll */

	switch (type) {
	    case FIRE_RES:
		if (!(HFire_resistance & FROMOUTSIDE)) {
			pline (Hallucination ? "You be chillin'." :
			    "You feel a momentary chill.");
			HFire_resistance |= FROMOUTSIDE;
		}
		break;

	    case SLEEP_RES:
		if (!(HSleep_resistance & FROMOUTSIDE)) {
			pline("You feel wide awake.");
			HSleep_resistance |= FROMOUTSIDE;
		}
		break;

	    case COLD_RES:
		if (!(HCold_resistance & FROMOUTSIDE)) {
			pline("You feel full of hot air.");
			HCold_resistance |= FROMOUTSIDE;
		}
		break;

	    case DISINT_RES:
		if (!(HDisint_resistance & FROMOUTSIDE)) {
			pline(Hallucination ?
			    "You feel totally together, man." :
			    "You feel very firm.");
			HDisint_resistance |= FROMOUTSIDE;
		}
		break;

	    case SHOCK_RES:	/* shock (electricity) resistance */
		if (!(HShock_resistance & FROMOUTSIDE)) {
			if (Hallucination)
				pline("You feel grounded in reality.");
			else
				pline("Your health currently feels amplified!");
			HShock_resistance |= FROMOUTSIDE;
		}
		break;

	    case POISON_RES:
		if (!(HPoison_resistance & FROMOUTSIDE)) {
			pline(Poison_resistance ?
				 "You feel especially healthy." : "You feel healthy.");
			HPoison_resistance |= FROMOUTSIDE;
		}
		break;

	    case TELEPORT:
		if (!(HTeleportation & FROMOUTSIDE)) {
			pline(Hallucination ? "You feel diffuse." :
			    "You feel very jumpy.");
			HTeleportation |= FROMOUTSIDE;
		}
		break;

	    case TELEPORT_CONTROL:
		if (!(HTeleport_control & FROMOUTSIDE)) {
			pline(Hallucination ?
			    "You feel centered in your personal space." :
			    "You feel in control of yourself.");
			HTeleport_control |= FROMOUTSIDE;
		}
		break;

	    case TELEPAT:
		if (!(HTelepat & FROMOUTSIDE)) {
			if (!BTelepat) {
			    pline(Hallucination ?
				"You feel in touch with the cosmos." :
				"You feel a strange mental acuity.");
			} else {
			    pline(Hallucination ?
				"You feel a strange mental acuity." :
				"You feel a dull aching inside your head.");
			}

			HTelepat |= FROMOUTSIDE;
			/* If blind, make sure monsters show up. */
			if (Blind) see_monsters();
		}
		break;

	    default:
		break;
	}
}